

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

bcf_hdr_t * vcf_hdr_read(htsFile *fp)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  kstream_t *ks;
  size_t sVar5;
  undefined1 *puVar6;
  kstring_t *pkVar7;
  ulong uVar8;
  byte *pbVar9;
  size_t sVar10;
  kstring_t *pkVar11;
  htsFile *tbx;
  char **__ptr;
  bcf_hrec_t *pbVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  BGZF *__n;
  kstring_t *htxt;
  int64_t *piVar17;
  uchar *puVar18;
  undefined1 *__size;
  int64_t *piVar19;
  int dret;
  int n;
  char buf [16];
  bcf_hdr_t *local_90;
  int local_84;
  htsFile *local_80;
  kstring_t *local_78;
  BGZF *local_70;
  kstring_t local_68;
  byte local_49 [25];
  
  pkVar7 = &fp->line;
  local_90 = bcf_hdr_init("r");
  htxt = (kstring_t *)0x0;
  __size = (undefined1 *)0x0;
  piVar17 = (int64_t *)0x0;
  local_78 = pkVar7;
  do {
    do {
      iVar3 = hts_getline(fp,2,pkVar7);
      if (iVar3 < 0) goto LAB_00115cae;
      sVar10 = pkVar7->l;
    } while (sVar10 == 0);
    pcVar13 = (fp->line).s;
    local_80 = fp;
    if (*pcVar13 != '#') {
      if (1 < hts_verbose) {
        vcf_hdr_read_cold_1();
      }
      free(htxt);
      bcf_hdr_destroy(local_90);
      goto LAB_00115e1e;
    }
    if ((pcVar13[1] != '#') && (fp->fn_aux != (char *)0x0)) {
      local_68.l = 0;
      local_68.m = 0;
      local_68.s = (char *)0x0;
      local_70 = (BGZF *)gzopen();
      ks = ks_init(local_70);
LAB_00115825:
      iVar3 = ks_getuntil2(ks,0,&local_68,&local_84,0);
      if (-1 < iVar3) {
        puVar6 = (undefined1 *)((long)piVar17 + 0xe);
        pkVar7 = htxt;
        if (puVar6 < __size) {
LAB_00115893:
          *(undefined8 *)((long)&pkVar7->l + (long)((long)piVar17 + 5)) = 0x3d44493c3d676974;
          *(undefined8 *)((long)&pkVar7->l + (long)piVar17) = 0x6769746e6f632323;
          *(undefined1 *)((long)&pkVar7->m + (long)((long)piVar17 + 5)) = 0;
          piVar17 = (int64_t *)((long)piVar17 + 0xd);
          htxt = pkVar7;
        }
        else {
          uVar15 = (ulong)puVar6 >> 1 | (ulong)puVar6;
          uVar15 = uVar15 >> 2 | uVar15;
          uVar15 = uVar15 >> 4 | uVar15;
          uVar15 = uVar15 >> 8 | uVar15;
          __size = (undefined1 *)((uVar15 >> 0x10 | uVar15) + 1);
          pkVar7 = (kstring_t *)realloc(htxt,(size_t)__size);
          if (pkVar7 != (kstring_t *)0x0) goto LAB_00115893;
        }
        pcVar13 = local_68.s;
        sVar5 = strlen(local_68.s);
        sVar5 = (size_t)(int)sVar5;
        puVar6 = (undefined1 *)((long)piVar17 + sVar5 + 1);
        pkVar7 = htxt;
        if (puVar6 < __size) {
LAB_00115926:
          htxt = pkVar7;
          memcpy((void *)((long)&htxt->l + (long)piVar17),pcVar13,sVar5);
          *(undefined1 *)((long)&htxt->l + (long)(sVar5 + (long)piVar17)) = 0;
          piVar17 = (int64_t *)(sVar5 + (long)piVar17);
        }
        else {
          uVar15 = (ulong)puVar6 >> 1 | (ulong)puVar6;
          uVar15 = uVar15 >> 2 | uVar15;
          uVar15 = uVar15 >> 4 | uVar15;
          uVar15 = uVar15 >> 8 | uVar15;
          __size = (undefined1 *)((uVar15 >> 0x10 | uVar15) + 1);
          pkVar7 = (kstring_t *)realloc(htxt,(size_t)__size);
          if (pkVar7 != (kstring_t *)0x0) goto LAB_00115926;
        }
        ks_getuntil2(ks,0,&local_68,&local_84,0);
        puVar6 = (undefined1 *)((long)piVar17 + 9);
        pkVar7 = htxt;
        if (puVar6 < __size) {
LAB_001159b2:
          *(undefined8 *)((long)&pkVar7->l + (long)piVar17) = 0x3d6874676e656c2c;
          *(undefined1 *)((long)&pkVar7->m + (long)piVar17) = 0;
          piVar17 = piVar17 + 1;
          htxt = pkVar7;
        }
        else {
          uVar15 = (ulong)puVar6 >> 1 | (ulong)puVar6;
          uVar15 = uVar15 >> 2 | uVar15;
          uVar15 = uVar15 >> 4 | uVar15;
          uVar15 = uVar15 >> 8 | uVar15;
          __size = (undefined1 *)((uVar15 >> 0x10 | uVar15) + 1);
          pkVar7 = (kstring_t *)realloc(htxt,(size_t)__size);
          if (pkVar7 != (kstring_t *)0x0) goto LAB_001159b2;
        }
        uVar8 = atol(local_68.s);
        iVar3 = (int)uVar8;
        uVar15 = (ulong)(uint)-iVar3;
        if (0 < iVar3) {
          uVar15 = uVar8 & 0xffffffff;
        }
        uVar8 = 0;
        do {
          uVar14 = (uint)uVar15;
          local_49[uVar8 + 1] = (char)uVar15 + (char)(uVar15 / 10) * -10 | 0x30;
          uVar8 = uVar8 + 1;
          uVar15 = uVar15 / 10;
        } while (9 < uVar14);
        if (iVar3 < 0) {
          uVar15 = uVar8 & 0xffffffff;
          uVar8 = (ulong)((int)uVar8 + 1);
          local_49[uVar15 + 1] = 0x2d;
        }
        puVar6 = (undefined1 *)((long)piVar17 + (long)(int)uVar8 + 1);
        pkVar7 = htxt;
        if (puVar6 < __size) {
LAB_00115a74:
          htxt = pkVar7;
          pbVar9 = local_49 + (uVar8 & 0xffffffff);
          iVar3 = (int)uVar8 + 1;
          do {
            *(byte *)((long)&htxt->l + (long)piVar17) = *pbVar9;
            piVar17 = (int64_t *)((long)piVar17 + 1);
            iVar3 = iVar3 + -1;
            pbVar9 = pbVar9 + -1;
          } while (1 < iVar3);
          *(undefined1 *)((long)&htxt->l + (long)piVar17) = 0;
        }
        else {
          uVar15 = (ulong)puVar6 >> 1 | (ulong)puVar6;
          uVar15 = uVar15 >> 2 | uVar15;
          uVar15 = uVar15 >> 4 | uVar15;
          uVar15 = uVar15 >> 8 | uVar15;
          __size = (undefined1 *)((uVar15 >> 0x10 | uVar15) + 1);
          pkVar7 = (kstring_t *)realloc(htxt,(size_t)__size);
          if (pkVar7 != (kstring_t *)0x0) goto LAB_00115a74;
        }
        piVar1 = (int *)((long)piVar17 + 3);
        pkVar7 = htxt;
        if (piVar1 < __size) {
LAB_00115af1:
          htxt = pkVar7;
          *(undefined2 *)((long)&htxt->l + (long)piVar17) = 0xa3e;
          *(undefined1 *)((long)&htxt->l + (long)((long)piVar17 + 2)) = 0;
          piVar17 = (int64_t *)((long)piVar17 + 2);
        }
        else {
          uVar15 = (ulong)piVar1 >> 1 | (ulong)piVar1;
          uVar15 = uVar15 >> 2 | uVar15;
          uVar15 = uVar15 >> 4 | uVar15;
          uVar15 = uVar15 >> 8 | uVar15;
          __size = (undefined1 *)((uVar15 >> 0x10 | uVar15) + 1);
          pkVar7 = (kstring_t *)realloc(htxt,(size_t)__size);
          if (pkVar7 != (kstring_t *)0x0) goto LAB_00115af1;
        }
        pkVar7 = local_78;
        if (local_84 != 10) {
          iVar3 = ks->begin;
          iVar4 = ks->end;
          do {
            if (((*(uint *)&ks->field_0x8 & 3) != 0) && (iVar4 <= iVar3)) break;
            puVar18 = ks->buf;
            if (iVar4 <= iVar3) {
              ks->begin = 0;
              iVar4 = gzread(ks->f,puVar18,(int)*(uint *)&ks->field_0x8 >> 2);
              ks->end = iVar4;
              if (iVar4 == 0) {
                *(uint *)&ks->field_0x8 = (*(uint *)&ks->field_0x8 & 0xfffffffc) + 1;
                break;
              }
              iVar3 = ks->begin;
              puVar18 = ks->buf;
            }
            ks->seek_pos = ks->seek_pos + 1;
            lVar16 = (long)iVar3;
            iVar3 = iVar3 + 1;
            ks->begin = iVar3;
          } while (puVar18[lVar16] != '\n');
        }
        goto LAB_00115825;
      }
      free(local_68.s);
      ks_destroy(ks);
      gzclose(local_70);
      sVar10 = (local_80->line).l;
      pcVar13 = (local_80->line).s;
    }
    __n = (BGZF *)(long)(int)sVar10;
    piVar19 = (int64_t *)(&__n->field_0x1 + (long)piVar17);
    pkVar11 = htxt;
    if (piVar19 < __size) {
LAB_00115c0e:
      htxt = pkVar11;
      memcpy((void *)((long)&htxt->l + (long)piVar17),pcVar13,(size_t)__n);
      *(undefined1 *)((long)&htxt->l + (long)(&__n->field_0x0 + (long)piVar17)) = 0;
      piVar17 = (int64_t *)(&__n->field_0x0 + (long)piVar17);
      pkVar7 = local_78;
    }
    else {
      uVar15 = (ulong)piVar19 >> 1 | (ulong)piVar19;
      uVar15 = uVar15 >> 2 | uVar15;
      uVar15 = uVar15 >> 4 | uVar15;
      uVar15 = uVar15 >> 8 | uVar15;
      __size = (undefined1 *)((uVar15 >> 0x10 | uVar15) + 1);
      local_70 = __n;
      pkVar11 = (kstring_t *)realloc(htxt,(size_t)__size);
      __n = local_70;
      if (pkVar11 != (kstring_t *)0x0) goto LAB_00115c0e;
      piVar19 = (int64_t *)((long)piVar17 + 1);
    }
    fp = local_80;
    pkVar11 = htxt;
    if (piVar19 < __size) {
LAB_00115c86:
      *(undefined1 *)((long)&pkVar11->l + (long)piVar17) = 10;
      *(undefined1 *)((long)&pkVar11->l + (long)piVar19) = 0;
      piVar17 = piVar19;
      htxt = pkVar11;
    }
    else {
      uVar15 = (ulong)piVar19 >> 1 | (ulong)piVar19;
      uVar15 = uVar15 >> 2 | uVar15;
      uVar15 = uVar15 >> 4 | uVar15;
      uVar15 = uVar15 >> 8 | uVar15;
      __size = (undefined1 *)((uVar15 >> 0x10 | uVar15) + 1);
      pkVar11 = (kstring_t *)realloc(htxt,(size_t)__size);
      if (pkVar11 != (kstring_t *)0x0) goto LAB_00115c86;
    }
  } while ((fp->line).s[1] == '#');
LAB_00115cae:
  if (htxt == (kstring_t *)0x0) {
    vcf_hdr_read_cold_2();
LAB_00115e1e:
    local_90 = (bcf_hdr_t *)0x0;
  }
  else {
    bcf_hdr_parse(local_90,(char *)htxt);
    tbx = (htsFile *)tbx_index_load(fp->fn);
    if (tbx != (htsFile *)0x0) {
      __ptr = tbx_seqnames((tbx_t *)tbx,(int *)&local_68);
      if ((int)local_68.l < 1) {
        free(__ptr);
        tbx_destroy((tbx_t *)tbx);
      }
      else {
        lVar16 = 0;
        bVar2 = false;
        iVar3 = (int)local_68.l;
        local_80 = tbx;
        local_78 = htxt;
        do {
          pbVar12 = bcf_hdr_get_hrec(local_90,3,"ID",__ptr[lVar16],(char *)0x0);
          if (pbVar12 == (bcf_hrec_t *)0x0) {
            pbVar12 = (bcf_hrec_t *)calloc(1,0x30);
            pcVar13 = strdup("contig");
            pbVar12->key = pcVar13;
            bcf_hrec_add_key(pbVar12,"ID",2);
            iVar3 = pbVar12->nkeys;
            pcVar13 = __ptr[lVar16];
            sVar5 = strlen(pcVar13);
            bcf_hrec_set_val(pbVar12,iVar3 + -1,pcVar13,(int)sVar5,0);
            bcf_hdr_add_hrec(local_90,pbVar12);
            bVar2 = true;
            iVar3 = (int)local_68.l;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < iVar3);
        free(__ptr);
        tbx_destroy((tbx_t *)local_80);
        htxt = local_78;
        if (bVar2) {
          bcf_hdr_sync(local_90);
        }
      }
    }
    free(htxt);
  }
  return local_90;
}

Assistant:

bcf_hdr_t *vcf_hdr_read(htsFile *fp)
{
    kstring_t txt, *s = &fp->line;
    bcf_hdr_t *h;
    h = bcf_hdr_init("r");
    txt.l = txt.m = 0; txt.s = 0;
    while (hts_getline(fp, KS_SEP_LINE, s) >= 0) {
        if (s->l == 0) continue;
        if (s->s[0] != '#') {
            if (hts_verbose >= 2)
                fprintf(stderr, "[E::%s] no sample line\n", __func__);
            free(txt.s);
            bcf_hdr_destroy(h);
            return 0;
        }
        if (s->s[1] != '#' && fp->fn_aux) { // insert contigs here
            int dret;
            gzFile f;
            kstream_t *ks;
            kstring_t tmp;
            tmp.l = tmp.m = 0; tmp.s = 0;
            f = gzopen(fp->fn_aux, "r");
            ks = ks_init(f);
            while (ks_getuntil(ks, 0, &tmp, &dret) >= 0) {
                int c;
                kputs("##contig=<ID=", &txt); kputs(tmp.s, &txt);
                ks_getuntil(ks, 0, &tmp, &dret);
                kputs(",length=", &txt); kputw(atol(tmp.s), &txt);
                kputsn(">\n", 2, &txt);
                if (dret != '\n')
                    while ((c = ks_getc(ks)) != '\n' && c != -1); // skip the rest of the line
            }
            free(tmp.s);
            ks_destroy(ks);
            gzclose(f);
        }
        kputsn(s->s, s->l, &txt);
        kputc('\n', &txt);
        if (s->s[1] != '#') break;
    }
    if ( !txt.s )
    {
        fprintf(stderr,"[%s:%d %s] Could not read the header\n", __FILE__,__LINE__,__FUNCTION__);
        return NULL;
    }
    bcf_hdr_parse(h, txt.s);

    // check tabix index, are all contigs listed in the header? add the missing ones
    tbx_t *idx = tbx_index_load(fp->fn);
    if ( idx )
    {
        int i, n, need_sync = 0;
        const char **names = tbx_seqnames(idx, &n);
        for (i=0; i<n; i++)
        {
            bcf_hrec_t *hrec = bcf_hdr_get_hrec(h, BCF_HL_CTG, "ID", (char*) names[i], NULL);
            if ( hrec ) continue;
            hrec = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
            hrec->key = strdup("contig");
            bcf_hrec_add_key(hrec, "ID", strlen("ID"));
            bcf_hrec_set_val(hrec, hrec->nkeys-1, (char*) names[i], strlen(names[i]), 0);
            bcf_hdr_add_hrec(h, hrec);
            need_sync = 1;
        }
        free(names);
        tbx_destroy(idx);
        if ( need_sync )
            bcf_hdr_sync(h);
    }
    free(txt.s);
    return h;
}